

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

bool convert<float,short>(TWaveformT<float> *src,TWaveformT<short> *dst)

{
  pointer pfVar1;
  pointer psVar2;
  ulong uVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  
  std::vector<short,_std::allocator<short>_>::resize
            (dst,(long)(src->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(src->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2);
  pfVar1 = (src->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar4 = (uint)((ulong)((long)(src->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pfVar1) >> 2);
  if (0 < (int)uVar4) {
    uVar3 = 0;
    dVar6 = 0.0;
    do {
      dVar5 = (double)ABS(pfVar1[uVar3]);
      if ((double)ABS(pfVar1[uVar3]) <= dVar6) {
        dVar5 = dVar6;
      }
      uVar3 = uVar3 + 1;
      dVar6 = dVar5;
    } while ((uVar4 & 0x7fffffff) != uVar3);
    if (0 < (int)uVar4) {
      psVar2 = (dst->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = 0;
      do {
        dVar6 = round((double)pfVar1[uVar3] *
                      (double)(~-(ulong)(dVar5 != 0.0) & 0x3ff0000000000000 |
                              (ulong)(1.0 / dVar5) & -(ulong)(dVar5 != 0.0)) * 32767.0);
        psVar2[uVar3] = (short)(int)dVar6;
        uVar3 = uVar3 + 1;
      } while ((uVar4 & 0x7fffffff) != uVar3);
    }
  }
  return true;
}

Assistant:

bool convert(const TWaveformT<TSampleSrc> & src, TWaveformT<TSampleDst> & dst) {
    static_assert(std::is_same<TSampleSrc, TSampleDst>::value == false, "Required different sample types");

    static_assert(std::is_same<TSampleSrc, TSampleF>::value, "Source sample type not supported");
    static_assert(std::is_same<TSampleDst, TSampleI16>::value, "Destination sample type not supported");

    dst.resize(src.size());

    double amax = calcAbsMax(src);
    double iamax = amax != 0.0 ? 1.0/amax : 1.0;
    for (auto i = 0; i < (int) src.size(); ++i) dst[i] = std::round(std::numeric_limits<TSampleDst>::max()*(src[i]*iamax));

    return true;
}